

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-merge.cpp
# Opt level: O3

void __thiscall
(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::
unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::
allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::
equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::
unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::
allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper::mapName(wasm::
ModuleItemKind,wasm::Name__(void *this,ModuleItemKind kind,Name *name)

{
  char *__code;
  _Hash_node_base *p_Var1;
  iterator iVar2;
  __node_base_ptr p_Var3;
  const_iterator cVar4;
  undefined1 local_220 [392];
  undefined1 local_98 [8];
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> visited;
  ModuleItemKind local_54;
  Name *pNStack_50;
  ModuleItemKind kind_local;
  key_type local_48;
  
  local_54 = kind;
  iVar2 = std::
          _Hashtable<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(*(_Hashtable<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   **)((long)this + 0x130),&local_54);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    __code = (name->super_IString).str._M_str;
    p_Var3 = std::
             _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       ((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_false>
                                  ._M_cur + 0x10),
                        (ulong)__code %
                        *(ulong *)((long)iVar2.
                                         super__Node_iterator_base<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_false>
                                         ._M_cur + 0x18),name,(__hash_code)__code);
    if ((p_Var3 != (__node_base_ptr)0x0) &&
       (p_Var1 = p_Var3->_M_nxt, p_Var1 != (_Hash_node_base *)0x0)) {
      local_48.super_IString.str._M_len = (size_t)p_Var1[3]._M_nxt;
      local_48.super_IString.str._M_str = (char *)p_Var1[4]._M_nxt;
      visited._M_t._M_impl.super__Rb_tree_header._M_node_count = (name->super_IString).str._M_len;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&visited;
      visited._M_t._M_impl._0_4_ = 0;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      pNStack_50 = name;
      while( true ) {
        p_Var3 = std::
                 _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::_M_find_before_node
                           ((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)((long)iVar2.
                                      super__Node_iterator_base<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_false>
                                      ._M_cur + 0x10),
                            (ulong)local_48.super_IString.str._M_str %
                            *(ulong *)((long)iVar2.
                                             super__Node_iterator_base<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_false>
                                             ._M_cur + 0x18),&local_48,
                            (__hash_code)local_48.super_IString.str._M_str);
        if ((p_Var3 == (__node_base_ptr)0x0) ||
           (p_Var1 = p_Var3->_M_nxt, p_Var1 == (_Hash_node_base *)0x0)) break;
        cVar4 = std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                        *)local_98,&local_48);
        if (cVar4._M_node != (_Base_ptr)&visited) {
          wasm::Fatal::Fatal((Fatal *)local_220);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_220 + 0x10),"wasm-merge: infinite loop of imports on ",0x28);
          wasm::Fatal::operator<<
                    ((Fatal *)local_220,
                     (Name *)&visited._M_t._M_impl.super__Rb_tree_header._M_node_count);
          wasm::Fatal::~Fatal((Fatal *)local_220);
        }
        std::
        _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
        ::_M_insert_unique<wasm::Name_const&>
                  ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                    *)local_98,&local_48);
        local_48.super_IString.str._M_len = (size_t)p_Var1[3]._M_nxt;
        local_48.super_IString.str._M_str = (char *)p_Var1[4]._M_nxt;
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)local_98);
      (pNStack_50->super_IString).str._M_len = local_48.super_IString.str._M_len;
      (pNStack_50->super_IString).str._M_str = local_48.super_IString.str._M_str;
    }
  }
  return;
}

Assistant:

void mapName(ModuleItemKind kind, Name& name) {
      auto iter = kindNameUpdates.find(kind);
      if (iter == kindNameUpdates.end()) {
        return;
      }
      auto& nameUpdates = iter->second;
      auto iter2 = nameUpdates.find(name);
      if (iter2 != nameUpdates.end()) {
        name = resolveName(nameUpdates, iter2->second, name);
      }
    }